

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

uint rf_gfx_load_texture(void *data,int width,int height,rf_pixel_format format,int mipmap_count)

{
  rf_source_location source_location;
  rf_source_location source_location_00;
  _Bool _Var1;
  uint uVar2;
  rf_gfx_pixel_format rVar3;
  int local_138 [2];
  int swizzle_mask_1 [4];
  int swizzle_mask [4];
  uint local_f4;
  uint uStack_f0;
  rf_gfx_pixel_format glformat;
  int mip_size;
  rf_int i;
  int local_bc;
  uint local_b8;
  int mip_offset;
  int mip_height;
  int mip_width;
  uint local_34;
  uint local_30;
  uint id;
  int mipmap_count_local;
  rf_pixel_format format_local;
  int height_local;
  int width_local;
  void *data_local;
  
  local_30 = mipmap_count;
  id = format;
  mipmap_count_local = height;
  format_local = width;
  _height_local = (char *)data;
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
  local_34 = 0;
  if ((((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_dxt_supported & 1U) == 0) &&
     ((((id == 0xb || (id == 0xc)) || (id == 0xd)) || (id == 0xe)))) {
    rf_log_impl(4,0x1b3e7b);
    data_local._4_4_ = local_34;
  }
  else if ((((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc1_supported & 1U) == 0) &&
          (id == 0xf)) {
    rf_log_impl(4,0x1b3ea7);
    data_local._4_4_ = local_34;
  }
  else if ((((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc2_supported & 1U) == 0) &&
          ((id == 0x10 || (id == 0x11)))) {
    rf_log_impl(4,0x1b3ed4);
    data_local._4_4_ = local_34;
  }
  else if ((((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_pvrt_supported & 1U) == 0) &&
          ((id == 0x12 || (id == 0x13)))) {
    rf_log_impl(4,0x1b3f01);
    data_local._4_4_ = local_34;
  }
  else if ((((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_astc_supported & 1U) == 0) &&
          ((id == 0x14 || (id == 0x15)))) {
    rf_log_impl(4,0x1b3f2e);
    data_local._4_4_ = local_34;
  }
  else {
    (*(rf__ctx->field_0).gfx_ctx.gl.PixelStorei)(0xcf5,1);
    (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&local_34);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,local_34);
    mip_offset = format_local;
    local_b8 = mipmap_count_local;
    local_bc = 0;
    rf_log_impl(1,0x1b3f5b,_height_local);
    for (stack0xffffffffffffff20 = 0; stack0xffffffffffffff20 < (int)local_30;
        register0x00000000 = stack0xffffffffffffff20 + 1) {
      uVar2 = rf_pixel_buffer_size(mip_offset,local_b8,id);
      rVar3 = rf_gfx_get_internal_texture_formats(id);
      source_location.proc_name._0_4_ = 0x1b3e67;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x9e2d;
      rf_log_impl(source_location,RF_LOG_TYPE_DEBUG,
                  "Load mipmap level %i (%i x %i), size: %i, offset: %i",stack0xffffffffffffff20,
                  (ulong)(uint)mip_offset,(ulong)local_b8,(ulong)uVar2,local_bc);
      if (((undefined1  [16])rVar3 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        _Var1 = rf_is_uncompressed_format(id);
        local_f4 = rVar3.internal_format;
        if (_Var1) {
          uStack_f0 = rVar3.format;
          glformat.internal_format = rVar3.type;
          (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
                    (0xde1,(int)stack0xffffffffffffff20,local_f4,mip_offset,local_b8,0,uStack_f0,
                     glformat.internal_format,_height_local + local_bc);
        }
        else {
          (*(rf__ctx->field_0).gfx_ctx.gl.CompressedTexImage2D)
                    (0xde1,(int)stack0xffffffffffffff20,local_f4,mip_offset,local_b8,0,uVar2,
                     _height_local + local_bc);
        }
        if (id == 1) {
          swizzle_mask_1[2] = 0x1903;
          swizzle_mask_1[3] = 0x1903;
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0xde1,0x8e46,swizzle_mask_1 + 2);
        }
        else if (id == 2) {
          local_138[0] = 0x1903;
          local_138[1] = 0x1903;
          swizzle_mask_1[0] = 0x1903;
          swizzle_mask_1[1] = 0x1904;
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0xde1,0x8e46,local_138);
        }
      }
      mip_offset = mip_offset / 2;
      local_b8 = (int)local_b8 / 2;
      local_bc = uVar2 + local_bc;
      if (mip_offset < 1) {
        mip_offset = 1;
      }
      if ((int)local_b8 < 1) {
        local_b8 = 1;
      }
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2802,0x2901);
    (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2803,0x2901);
    (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2600);
    (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2600);
    if (1 < (int)local_30) {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2703);
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
    if (local_34 == 0) {
      rf_log_impl(4,0x1b3ffd);
    }
    else {
      source_location_00.proc_name._0_4_ = 0x1b3e67;
      source_location_00.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location_00.proc_name._4_4_ = 0;
      source_location_00.line_in_file = 0x9e79;
      rf_log_impl(source_location_00,RF_LOG_TYPE_INFO,
                  "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)",(ulong)local_34
                  ,(ulong)format_local,(ulong)(uint)mipmap_count_local,(ulong)local_30);
    }
    data_local._4_4_ = local_34;
  }
  return data_local._4_4_;
}

Assistant:

RF_API unsigned int rf_gfx_load_texture(void* data, int width, int height, rf_pixel_format format, int mipmap_count)
{
    rf_gl.BindTexture(GL_TEXTURE_2D, 0); // Free any old binding

    unsigned int id = 0;

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
    if ((!rf_gfx.extensions.tex_comp_dxt_supported) && ((format == RF_COMPRESSED_DXT1_RGB) || (format == RF_COMPRESSED_DXT1_RGBA) || (format == RF_COMPRESSED_DXT3_RGBA) || (format == RF_COMPRESSED_DXT5_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "DXT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc1_supported) && (format == RF_COMPRESSED_ETC1_RGB))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC1 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc2_supported) && ((format == RF_COMPRESSED_ETC2_RGB) || (format == RF_COMPRESSED_ETC2_EAC_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC2 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_pvrt_supported) && ((format == RF_COMPRESSED_PVRT_RGB) || (format == RF_COMPRESSED_PVRT_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "PVRT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_astc_supported) && ((format == RF_COMPRESSED_ASTC_4x4_RGBA) || (format == RF_COMPRESSED_ASTC_8x8_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ASTC compressed texture format not supported");
        return id;
    }

    rf_gl.PixelStorei(GL_UNPACK_ALIGNMENT, 1);

    rf_gl.GenTextures(1, &id);              // Generate texture id

    //rf_gl.ActiveTexture(GL_TEXTURE0);     // If not defined, using GL_TEXTURE0 by default (shader texture)

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    int mip_width = width;
    int mip_height = height;
    int mip_offset = 0;          // Mipmap data offset

    RF_LOG(RF_LOG_TYPE_DEBUG, "Load texture from data memory address: 0x%x", data);

    // Load the different mipmap levels
    for (rf_int i = 0; i < mipmap_count; i++)
    {
        int mip_size = rf_pixel_buffer_size(mip_width, mip_height, format);

        rf_gfx_pixel_format glformat = rf_gfx_get_internal_texture_formats(format);

        RF_LOG(RF_LOG_TYPE_DEBUG, "Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mip_width, mip_height, mip_size, mip_offset);

        if (glformat.valid)
        {
            if (rf_is_uncompressed_format(format))
            {
                rf_gl.TexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, glformat.format, glformat.type, (unsigned char* )data + mip_offset);
            }
            else
            {
                rf_gl.CompressedTexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, mip_size, (unsigned char *)data + mip_offset);
            }

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                if (format == RF_UNCOMPRESSED_GRAYSCALE)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
                else if (format == RF_UNCOMPRESSED_GRAY_ALPHA)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
            #endif
        }

        mip_width /= 2;
        mip_height /= 2;
        mip_offset += mip_size;

        // Security check for NPOT textures
        if (mip_width < 1) mip_width = 1;
        if (mip_height < 1) mip_height = 1;
    }

    // rf_texture parameters configuration
    // NOTE: rf_gl.TexParameteri does NOT affect texture uploading, just the way it's used
    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
        // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
        if (rf_gfx.extensions.tex_npot_supported)
        {
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
        }
        else
        {
            // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
        }
    #else
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    #endif

    // Magnification and minification filters
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
    if (mipmap_count > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
    #endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    rf_gl.BindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) RF_LOG(RF_LOG_TYPE_INFO, "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)", id, width, height, mipmap_count);
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture could not be created");

    return id;
}